

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

void __thiscall
QOpenGL2PaintEngineExPrivate::transferMode(QOpenGL2PaintEngineExPrivate *this,EngineMode newMode)

{
  QOpenGLEngineShaderManager *pQVar1;
  QOpenGLPoint *pQVar2;
  float *data;
  qsizetype qVar3;
  long lVar4;
  socklen_t in_ECX;
  socklen_t sVar5;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  if (this->mode == newMode) {
    return;
  }
  pQVar1 = this->shaderManager;
  if (newMode == TextDrawingMode) {
    pQVar1->shaderProgNeedsChanging = true;
    pQVar1->complexGeometry = true;
    goto LAB_0014293f;
  }
  pQVar1->shaderProgNeedsChanging = true;
  pQVar1->complexGeometry = false;
  if (newMode == ImageDrawingMode) {
    QOpenGLBuffer::bind(&this->vertexBuffer,0,in_RDX,in_ECX);
    QOpenGLBuffer::allocate(&this->vertexBuffer,this->staticVertexCoordinateArray,0x20);
    iVar6 = 2;
    sVar5 = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
    QOpenGLBuffer::bind(&this->texCoordBuffer,iVar6,__addr_01,sVar5);
    QOpenGLBuffer::allocate(&this->texCoordBuffer,this->staticTextureCoordinateArray,0x20);
    lVar4 = *(long *)&this->funcs;
    uVar8 = 1;
    uVar7 = 2;
LAB_0014291e:
    (**(code **)(lVar4 + 0x468))(uVar8,uVar7,0x1406,0,0,0);
  }
  else if (newMode - ImageArrayDrawingMode < 2) {
    pQVar2 = (this->vertexCoordinateArray).vertexArray.buffer;
    qVar3 = (this->vertexCoordinateArray).vertexArray.siz;
    QOpenGLBuffer::bind(&this->vertexBuffer,newMode,in_RDX,in_ECX);
    QOpenGLBuffer::allocate(&this->vertexBuffer,pQVar2,(int)qVar3 << 3);
    iVar6 = 2;
    sVar5 = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(0,2,0x1406,0,0,0);
    pQVar2 = (this->textureCoordinateArray).vertexArray.buffer;
    qVar3 = (this->textureCoordinateArray).vertexArray.siz;
    QOpenGLBuffer::bind(&this->texCoordBuffer,iVar6,__addr,sVar5);
    QOpenGLBuffer::allocate(&this->texCoordBuffer,pQVar2,(int)qVar3 << 3);
    iVar6 = 2;
    sVar5 = 0;
    (**(code **)(*(long *)&this->funcs + 0x468))(1,2,0x1406,0,0,0);
    if (newMode == ImageOpacityArrayDrawingMode) {
      data = (this->opacityArray).buffer;
      qVar3 = (this->opacityArray).siz;
      QOpenGLBuffer::bind(&this->opacityBuffer,iVar6,__addr_00,sVar5);
      QOpenGLBuffer::allocate(&this->opacityBuffer,data,(int)qVar3 << 2);
      lVar4 = *(long *)&this->funcs;
      uVar8 = 2;
      uVar7 = 1;
      goto LAB_0014291e;
    }
  }
  QOpenGLEngineShaderManager::setMaskType((QOpenGLEngineShaderManager *)this->shaderManager,NoMask);
LAB_0014293f:
  this->mode = newMode;
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::transferMode(EngineMode newMode)
{
    if (newMode == mode)
        return;

    if (newMode == TextDrawingMode) {
        shaderManager->setHasComplexGeometry(true);
    } else {
        shaderManager->setHasComplexGeometry(false);
    }

    if (newMode == ImageDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, staticVertexCoordinateArray, 8);
        uploadData(QT_TEXTURE_COORDS_ATTR, staticTextureCoordinateArray, 8);
    }

    if (newMode == ImageArrayDrawingMode || newMode == ImageOpacityArrayDrawingMode) {
        uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
        uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);

        if (newMode == ImageOpacityArrayDrawingMode)
            uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());
    }

    // This needs to change when we implement high-quality anti-aliasing...
    if (newMode != TextDrawingMode)
        shaderManager->setMaskType(QOpenGLEngineShaderManager::NoMask);

    mode = newMode;
}